

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O1

void __thiscall
capnp::EzRpcClient::Impl::ClientContext::ClientContext
          (ClientContext *this,Own<kj::AsyncIoStream> *stream,ReaderOptions readerOpts)

{
  ReaderOptions receiveOptions;
  
  (this->stream).disposer = stream->disposer;
  (this->stream).ptr = stream->ptr;
  stream->ptr = (AsyncIoStream *)0x0;
  receiveOptions._12_4_ = 0;
  receiveOptions.traversalLimitInWords = SUB128(readerOpts._0_12_,0);
  receiveOptions.nestingLimit = SUB124(readerOpts._0_12_,8);
  TwoPartyVatNetwork::TwoPartyVatNetwork(&this->network,(this->stream).ptr,CLIENT,receiveOptions);
  makeRpcClient<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>
            ((capnp *)&this->rpcSystem,&(this->network).super_TwoPartyVatNetworkBase);
  return;
}

Assistant:

ClientContext(kj::Own<kj::AsyncIoStream>&& stream, ReaderOptions readerOpts)
        : stream(kj::mv(stream)),
          network(*this->stream, rpc::twoparty::Side::CLIENT, readerOpts),
          rpcSystem(makeRpcClient(network)) {}